

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

expected<const_Command::Arg_*,_Commands::MatchFailure> *
make_expected_error(expected<const_Command::Arg_*,_Commands::MatchFailure> *__return_storage_ptr__,
                   shared_ptr<const_SyntaxTree> *hint,Arg *arginfo)

{
  element_type *peVar1;
  unreachable_exception *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  switch(arginfo->type) {
  case Param:
    peVar1 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        __return_storage_ptr__->has_value = false;
        (__return_storage_ptr__->contained).m_value = (value_type)peVar1;
        (__return_storage_ptr__->contained).m_error.context.
        super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00
        ;
        (__return_storage_ptr__->contained).m_error.reason = BadArgument;
LAB_00166880:
        if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          return __return_storage_ptr__;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        return __return_storage_ptr__;
      }
    }
    __return_storage_ptr__->has_value = false;
    (__return_storage_ptr__->contained).m_value = (value_type)peVar1;
    (__return_storage_ptr__->contained).m_error.context.
    super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
    (__return_storage_ptr__->contained).m_error.reason = BadArgument;
    break;
  case Label:
    peVar1 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        __return_storage_ptr__->has_value = false;
        (__return_storage_ptr__->contained).m_value = (value_type)peVar1;
        (__return_storage_ptr__->contained).m_error.context.
        super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00
        ;
        (__return_storage_ptr__->contained).m_error.reason = NoSuchLabel;
        goto LAB_00166880;
      }
    }
    __return_storage_ptr__->has_value = false;
    (__return_storage_ptr__->contained).m_value = (value_type)peVar1;
    (__return_storage_ptr__->contained).m_error.context.
    super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
    (__return_storage_ptr__->contained).m_error.reason = NoSuchLabel;
    break;
  case Integer:
    peVar1 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        __return_storage_ptr__->has_value = false;
        (__return_storage_ptr__->contained).m_value = (value_type)peVar1;
        (__return_storage_ptr__->contained).m_error.context.
        super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00
        ;
        (__return_storage_ptr__->contained).m_error.reason = ExpectedInt;
        goto LAB_00166880;
      }
    }
    __return_storage_ptr__->has_value = false;
    (__return_storage_ptr__->contained).m_value = (value_type)peVar1;
    (__return_storage_ptr__->contained).m_error.context.
    super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
    (__return_storage_ptr__->contained).m_error.reason = ExpectedInt;
    return __return_storage_ptr__;
  case Float:
    peVar1 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        __return_storage_ptr__->has_value = false;
        (__return_storage_ptr__->contained).m_value = (value_type)peVar1;
        (__return_storage_ptr__->contained).m_error.context.
        super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00
        ;
        (__return_storage_ptr__->contained).m_error.reason = ExpectedFloat;
        goto LAB_00166880;
      }
    }
    __return_storage_ptr__->has_value = false;
    (__return_storage_ptr__->contained).m_value = (value_type)peVar1;
    (__return_storage_ptr__->contained).m_error.context.
    super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
    (__return_storage_ptr__->contained).m_error.reason = ExpectedFloat;
    return __return_storage_ptr__;
  case TextLabel:
  case TextLabel16:
    peVar1 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        __return_storage_ptr__->has_value = false;
        (__return_storage_ptr__->contained).m_value = (value_type)peVar1;
        (__return_storage_ptr__->contained).m_error.context.
        super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00
        ;
        (__return_storage_ptr__->contained).m_error.reason = ExpectedTextLabel;
        goto LAB_00166880;
      }
    }
    __return_storage_ptr__->has_value = false;
    (__return_storage_ptr__->contained).m_value = (value_type)peVar1;
    (__return_storage_ptr__->contained).m_error.context.
    super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
    (__return_storage_ptr__->contained).m_error.reason = ExpectedTextLabel;
    return __return_storage_ptr__;
  case TextLabel32:
  case String:
    peVar1 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        __return_storage_ptr__->has_value = false;
        (__return_storage_ptr__->contained).m_value = (value_type)peVar1;
        (__return_storage_ptr__->contained).m_error.context.
        super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00
        ;
        (__return_storage_ptr__->contained).m_error.reason = ExpectedStringLiteral;
        goto LAB_00166880;
      }
    }
    __return_storage_ptr__->has_value = false;
    (__return_storage_ptr__->contained).m_value = (value_type)peVar1;
    (__return_storage_ptr__->contained).m_error.context.
    super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
    (__return_storage_ptr__->contained).m_error.reason = ExpectedStringLiteral;
    return __return_storage_ptr__;
  case Constant:
    peVar1 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (hint->super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        __return_storage_ptr__->has_value = false;
        (__return_storage_ptr__->contained).m_value = (value_type)peVar1;
        (__return_storage_ptr__->contained).m_error.context.
        super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00
        ;
        (__return_storage_ptr__->contained).m_error.reason = NoSuchConstant;
        goto LAB_00166880;
      }
    }
    __return_storage_ptr__->has_value = false;
    (__return_storage_ptr__->contained).m_value = (value_type)peVar1;
    (__return_storage_ptr__->contained).m_error.context.
    super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
    (__return_storage_ptr__->contained).m_error.reason = NoSuchConstant;
    return __return_storage_ptr__;
  default:
    this = (unreachable_exception *)__cxa_allocate_exception(0x10);
    unreachable_exception::unreachable_exception
              (this,
               "Unreachable code reached at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/commands.cpp(239)."
              );
    __cxa_throw(this,&unreachable_exception::typeinfo,std::runtime_error::~runtime_error);
  }
  return __return_storage_ptr__;
}

Assistant:

static auto make_expected_error(const shared_ptr<const SyntaxTree>& hint, 
                                const Command::Arg& arginfo) -> expected<const Command::Arg*, MatchFailure>
{
    switch(arginfo.type)
    {
        case ArgType::Param:
            return make_unexpected(MatchFailure{ hint, MatchFailure::BadArgument });
        case ArgType::Integer:
            return make_unexpected(MatchFailure{ hint, MatchFailure::ExpectedInt });
        case ArgType::Float:
            return make_unexpected(MatchFailure{ hint, MatchFailure::ExpectedFloat });
        case ArgType::Label:
            return make_unexpected(MatchFailure{ hint, MatchFailure::NoSuchLabel });
        case ArgType::Constant:
            return make_unexpected(MatchFailure{ hint, MatchFailure::NoSuchConstant });
        case ArgType::TextLabel:
        case ArgType::TextLabel16:
            return make_unexpected(MatchFailure{ hint, MatchFailure::ExpectedTextLabel });
        case ArgType::TextLabel32:
        case ArgType::String:
            return make_unexpected(MatchFailure{ hint, MatchFailure::ExpectedStringLiteral });
        default:
            Unreachable();
    }
}